

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line_table_reader_common.h
# Opt level: O0

int read_uword_de(Dwarf_Small **lp,Dwarf_Unsigned *out_p,Dwarf_Debug dbg,Dwarf_Error *err,
                 Dwarf_Small *lpend)

{
  int iVar1;
  Dwarf_Unsigned DStack_58;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned out;
  Dwarf_Small *inptr;
  Dwarf_Small *lpend_local;
  Dwarf_Error *err_local;
  Dwarf_Debug dbg_local;
  Dwarf_Unsigned *out_p_local;
  Dwarf_Small **lp_local;
  
  out = (Dwarf_Unsigned)*lp;
  lu_leblen = 0;
  lu_local = 0;
  DStack_58 = 0;
  inptr = lpend;
  lpend_local = (Dwarf_Small *)err;
  err_local = (Dwarf_Error *)dbg;
  dbg_local = (Dwarf_Debug)out_p;
  out_p_local = (Dwarf_Unsigned *)lp;
  iVar1 = dwarf_decode_leb128((char *)out,&lu_local,&stack0xffffffffffffffa8,(char *)lpend);
  if (iVar1 != 1) {
    *out_p_local = lu_local + out;
    dbg_local->de_magic = DStack_58;
  }
  else {
    _dwarf_error_string((Dwarf_Debug)err_local,(Dwarf_Error *)lpend_local,0x149,
                        "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
  }
  lp_local._4_4_ = (uint)(iVar1 == 1);
  return lp_local._4_4_;
}

Assistant:

static int
read_uword_de(Dwarf_Small **lp,
    Dwarf_Unsigned *out_p,
    Dwarf_Debug dbg,
    Dwarf_Error *err,
    Dwarf_Small *lpend)
{
    Dwarf_Small *inptr = *lp;
    Dwarf_Unsigned out = 0;
    DECODE_LEB128_UWORD_CK(inptr,
        out,
        dbg,err,lpend);
    *lp = inptr;
    *out_p = out;
    return DW_DLV_OK;
}